

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O0

void fstk_RunMacro(char *macroName,MacroArgs *args)

{
  int iVar1;
  uint32_t uVar2;
  Symbol *__s;
  MacroArgs *pMVar3;
  size_t __n;
  size_t sVar4;
  FileStackNode *fileInfo_00;
  int *piVar5;
  char *pcVar6;
  LexerState *pLVar7;
  uint local_6c;
  int nbChars;
  uint32_t i;
  FileStackReptNode *reptNode_1;
  char *dest;
  FileStackNamedNode *fileInfo;
  size_t macroNameLen;
  size_t baseLen;
  FileStackNamedNode *baseNode;
  FileStackReptNode *reptNode;
  FileStackNode *node;
  size_t reptNameLen;
  Symbol *macro;
  MacroArgs *args_local;
  char *macroName_local;
  
  __s = sym_FindExactSymbol(macroName);
  if (__s == (Symbol *)0x0) {
    error("Macro \"%s\" not defined\n",macroName);
  }
  else if (__s->type == SYM_MACRO) {
    pMVar3 = macro_GetCurrentArgs();
    contextStack->macroArgs = pMVar3;
    node = (FileStackNode *)0x0;
    reptNode = (FileStackReptNode *)__s->src;
    if ((reptNode->node).type == NODE_REPT) {
      node = (FileStackNode *)((ulong)reptNode->reptDepth * 0x11);
      do {
        reptNode = (FileStackReptNode *)(reptNode->node).parent;
      } while ((reptNode->node).type == NODE_REPT);
    }
    __n = strlen((char *)&reptNode->reptDepth);
    sVar4 = strlen(__s->name);
    fileInfo_00 = (FileStackNode *)malloc((long)&node[1].parent + sVar4 + __n + 3);
    if (fileInfo_00 == (FileStackNode *)0x0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      error("Failed to alloc file info for \"%s\": %s\n",__s,pcVar6);
    }
    else {
      fileInfo_00->type = NODE_MACRO;
      memcpy(fileInfo_00 + 1,&reptNode->reptDepth,__n);
      reptNode_1 = (FileStackReptNode *)((long)&fileInfo_00[1].parent + __n);
      if ((reptNode->node).type == NODE_REPT) {
        local_6c = reptNode->reptDepth;
        while (local_6c != 0) {
          iVar1 = sprintf((char *)reptNode_1,"::REPT~%u",
                          (ulong)*(uint *)(&reptNode->field_0x2c + (ulong)(local_6c - 1) * 4));
          if (iVar1 < 0) {
            piVar5 = __errno_location();
            pcVar6 = strerror(*piVar5);
            fatalerror("Failed to write macro invocation info: %s\n",pcVar6);
          }
          reptNode_1 = (FileStackReptNode *)((long)&(reptNode_1->node).parent + (long)iVar1);
          local_6c = local_6c - 1;
        }
      }
      *(undefined1 *)&(reptNode_1->node).parent = 0x3a;
      *(undefined1 *)((long)&(reptNode_1->node).parent + 1) = 0x3a;
      memcpy((void *)((long)&(reptNode_1->node).parent + 2),__s,sVar4 + 1);
      newContext(fileInfo_00);
      pLVar7 = lexer_OpenFileView("MACRO",(__s->field_8).field_2.macro,
                                  (__s->field_8).field_2.macroSize,__s->fileLine);
      contextStack->lexerState = pLVar7;
      if (contextStack->lexerState == (LexerState *)0x0) {
        fatalerror("Failed to set up lexer for macro invocation\n");
      }
      lexer_SetStateAtEOL(contextStack->lexerState);
      uVar2 = macro_UseNewUniqueID();
      contextStack->uniqueID = uVar2;
      macro_UseNewArgs(args);
    }
  }
  else {
    error("\"%s\" is not a macro\n",macroName);
  }
  return;
}

Assistant:

void fstk_RunMacro(char const *macroName, struct MacroArgs *args)
{
	struct Symbol *macro = sym_FindExactSymbol(macroName);

	if (!macro) {
		error("Macro \"%s\" not defined\n", macroName);
		return;
	}
	if (macro->type != SYM_MACRO) {
		error("\"%s\" is not a macro\n", macroName);
		return;
	}
	contextStack->macroArgs = macro_GetCurrentArgs();

	// Compute total length of this node's name: <base name>::<macro>
	size_t reptNameLen = 0;
	struct FileStackNode const *node = macro->src;

	if (node->type == NODE_REPT) {
		struct FileStackReptNode const *reptNode = (struct FileStackReptNode const *)node;

		// 4294967295 = 2^32 - 1, aka UINT32_MAX
		reptNameLen += reptNode->reptDepth * strlen("::REPT~4294967295");
		// Look for next named node
		do {
			node = node->parent;
		} while (node->type == NODE_REPT);
	}
	struct FileStackNamedNode const *baseNode = (struct FileStackNamedNode const *)node;
	size_t baseLen = strlen(baseNode->name);
	size_t macroNameLen = strlen(macro->name);
	struct FileStackNamedNode *fileInfo = (struct FileStackNamedNode *)malloc(sizeof(*fileInfo) +
			baseLen + reptNameLen + 2 + macroNameLen + 1);

	if (!fileInfo) {
		error("Failed to alloc file info for \"%s\": %s\n", macro->name, strerror(errno));
		return;
	}
	fileInfo->node.type = NODE_MACRO;
	// Print the name...
	char *dest = fileInfo->name;

	memcpy(dest, baseNode->name, baseLen);
	dest += baseLen;
	if (node->type == NODE_REPT) {
		struct FileStackReptNode const *reptNode = (struct FileStackReptNode const *)node;

		for (uint32_t i = reptNode->reptDepth; i--; ) {
			int nbChars = sprintf(dest, "::REPT~%" PRIu32, reptNode->iters[i]);

			if (nbChars < 0)
				fatalerror("Failed to write macro invocation info: %s\n",
					   strerror(errno));
			dest += nbChars;
		}
	}
	*dest++ = ':';
	*dest++ = ':';
	memcpy(dest, macro->name, macroNameLen + 1);

	newContext((struct FileStackNode *)fileInfo);
	contextStack->lexerState = lexer_OpenFileView("MACRO", macro->macro, macro->macroSize,
						      macro->fileLine);
	if (!contextStack->lexerState)
		fatalerror("Failed to set up lexer for macro invocation\n");
	lexer_SetStateAtEOL(contextStack->lexerState);
	contextStack->uniqueID = macro_UseNewUniqueID();
	macro_UseNewArgs(args);
}